

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Export.cpp
# Opt level: O3

Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
exportC_abi_cxx11_(Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *__return_storage_ptr__,Resources *res,ExportSettings *settings,Pipeline *p,
                  IAutomation *automation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  _Rb_tree_color _Var4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  Flag FVar8;
  pointer pbVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  pointer pTVar12;
  pointer pFVar13;
  undefined8 uVar14;
  Resources *pRVar15;
  byte bVar16;
  const_iterator cVar17;
  const_iterator cVar18;
  FILE *pFVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar21;
  pointer pTVar22;
  pointer pPVar23;
  _Alloc_hider _Var24;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar25;
  char *pcVar26;
  undefined *puVar27;
  Section *it;
  long lVar28;
  pointer pFVar29;
  FILE *pFVar30;
  _Base_ptr *__k;
  size_t __size;
  char *pcVar31;
  size_t i_1;
  pointer pbVar32;
  _Base_ptr p_Var33;
  pointer pCVar34;
  Command *cmd;
  ulong uVar35;
  pointer pCVar36;
  Pipeline *pPVar37;
  size_t i;
  ulong uVar38;
  bool bVar39;
  shared_ptr<PolledShaderSource> shader;
  string filename;
  string vname;
  shared_ptr<PolledShaderSource> shader_1;
  ExportResult automation_result;
  Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  automation_export;
  UniformsMap global_uniforms;
  string local_210;
  FILE *local_1f0;
  undefined1 local_1e8 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b0;
  pointer p_Stack_1a8;
  byte local_1a0;
  Resources *local_198;
  Pipeline *local_190;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_188;
  pointer local_180;
  ExportSettings *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [16];
  undefined1 local_120 [32];
  _Rb_tree_node_base local_100;
  int local_d8;
  undefined1 local_d0 [24];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
  _Stack_b8;
  undefined4 local_88;
  bool local_80;
  _Base_ptr local_78;
  _Base_ptr local_70;
  _Base_ptr local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
  local_60;
  
  p_Var33 = (_Base_ptr)(settings->c_source)._M_dataplus._M_p;
  local_198 = res;
  local_180 = (pointer)automation;
  local_178 = settings;
  aAppDebugPrintf("Exporting rendering pipeline to \'%s\'",p_Var33);
  local_1f0 = fopen((char *)p_Var33,"w");
  if (local_1f0 == (FILE *)0x0) {
    format_abi_cxx11_((string *)local_120,"Cannot open file \'%s\' for writing",p_Var33);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_120 + 0x10)) {
      _Stack_b8._M_impl._0_8_ = local_120._24_8_;
      local_120._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(local_d0 + 0x10);
    }
    paVar25 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_0 = paVar25;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_d0 + 0x10)) {
      paVar25->_M_allocated_capacity = local_120._16_8_;
      *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
           _Stack_b8._M_impl._0_8_;
    }
    else {
      (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)local_120._0_8_;
      (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
           local_120._16_8_;
    }
    (__return_storage_ptr__->field_0).error_.error_._M_string_length = local_120._8_8_;
    __return_storage_ptr__->has_value_ = false;
  }
  else {
    local_60._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_60._M_impl.super__Rb_tree_header._M_header;
    local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
    pbVar32 = (p->shader_filenames).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pbVar9 = (p->shader_filenames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_190 = p;
    local_188 = __return_storage_ptr__;
    local_78 = p_Var33;
    local_60._M_impl.super__Rb_tree_header._M_header._M_right =
         local_60._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pbVar32 != pbVar9) {
      do {
        Resources::getShaderSource((Resources *)local_1e8,(string *)local_198);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._0_8_ ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          format_abi_cxx11_((string *)local_120,"Cannot open shader \'%s\'",
                            (pbVar32->_M_dataplus)._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_120 + 0x10)) {
            _Stack_b8._M_impl._0_8_ = local_120._24_8_;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_d0 + 0x10);
          }
          else {
            local_d0._0_8_ = local_120._0_8_;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_120._0_8_;
          }
          paVar21 = &(local_188->field_0).error_.error_.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&local_188->field_0 = paVar21;
          if (paVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_d0 + 0x10)) {
            paVar21->_M_allocated_capacity = local_120._16_8_;
            *(undefined8 *)((long)&(local_188->field_0).error_.error_.field_2 + 8) =
                 _Stack_b8._M_impl._0_8_;
          }
          else {
            (local_188->field_0).error_.error_._M_dataplus._M_p = (pointer)paVar25;
            (local_188->field_0).error_.error_.field_2._M_allocated_capacity = local_120._16_8_;
          }
          (local_188->field_0).error_.error_._M_string_length = local_120._8_8_;
          local_188->has_value_ = false;
          pFVar30 = local_1f0;
          __return_storage_ptr__ = local_188;
LAB_00110217:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
          }
          goto LAB_0011038b;
        }
        aAppDebugPrintf("%s: uniforms: %d",(pbVar32->_M_dataplus)._M_p,
                        (ulong)*(uint *)(local_1e8._0_8_ + 200));
        ::shader::appendUniforms
                  ((Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_d0,(UniformsMap *)&local_60,(UniformsMap *)(local_1e8._0_8_ + 0xa0));
        if ((bool)(undefined1)_Stack_b8._M_impl.super__Rb_tree_header._M_header._M_color == false) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (local_1e8 + 0x28),"Error merging uniforms from vertex: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_d0);
          __return_storage_ptr__ = local_188;
          pFVar30 = local_1f0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._40_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1e8 + 0x38)) {
            local_120._24_8_ = p_Stack_1a8;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(local_120 + 0x10);
          }
          else {
            local_120._0_8_ = local_1e8._40_8_;
            paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._40_8_;
          }
          paVar21 = &(local_188->field_0).error_.error_.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&local_188->field_0 = paVar21;
          if (paVar25 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_120 + 0x10)) {
            paVar21->_M_allocated_capacity = (size_type)local_1b0;
            *(undefined8 *)((long)&(local_188->field_0).error_.error_.field_2 + 8) =
                 local_120._24_8_;
          }
          else {
            (local_188->field_0).error_.error_._M_dataplus._M_p = (pointer)paVar25;
            (local_188->field_0).error_.error_.field_2._M_allocated_capacity = (size_type)local_1b0;
          }
          (local_188->field_0).error_.error_._M_string_length = (size_type)local_1b8;
          local_188->has_value_ = false;
          if ((((undefined1)_Stack_b8._M_impl.super__Rb_tree_header._M_header._M_color & 1) == 0) &&
             ((undefined1 *)local_d0._0_8_ != local_d0 + 0x10)) {
            operator_delete((void *)local_d0._0_8_,local_d0._16_8_ + 1);
          }
          goto LAB_00110217;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._8_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
        }
        pbVar32 = pbVar32 + 1;
      } while (pbVar32 != pbVar9);
    }
    (**(code **)(*(long *)local_180 + 0x30))(local_d0,local_180,1,"C",&local_60);
    __return_storage_ptr__ = local_188;
    pPVar37 = local_190;
    pFVar30 = local_1f0;
    if (local_80 == false) {
      format_abi_cxx11_((string *)(local_1e8 + 0x28),"Error exporting automation data: %s",
                        local_d0._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e8._40_8_ ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_1e8 + 0x38)) {
        local_120._24_8_ = p_Stack_1a8;
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_120 + 0x10);
      }
      else {
        local_120._0_8_ = local_1e8._40_8_;
        paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._40_8_;
      }
      paVar21 = &(__return_storage_ptr__->field_0).error_.error_.field_2;
      *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)&__return_storage_ptr__->field_0 = paVar21;
      if (paVar25 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_120 + 0x10)) {
        paVar21->_M_allocated_capacity = (size_type)local_1b0;
        *(undefined8 *)((long)&(__return_storage_ptr__->field_0).error_.error_.field_2 + 8) =
             local_120._24_8_;
      }
      else {
        (__return_storage_ptr__->field_0).error_.error_._M_dataplus._M_p = (pointer)paVar25;
        (__return_storage_ptr__->field_0).error_.error_.field_2._M_allocated_capacity =
             (size_type)local_1b0;
      }
      (__return_storage_ptr__->field_0).error_.error_._M_string_length = (size_type)local_1b8;
      __return_storage_ptr__->has_value_ = false;
    }
    else {
      std::vector<Section,_std::allocator<Section>_>::vector
                ((vector<Section,_std::allocator<Section>_> *)local_120,
                 (vector<Section,_std::allocator<Section>_> *)local_d0);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                  *)(local_120 + 0x18),&_Stack_b8);
      local_d8 = local_88;
      p_Var33 = (_Base_ptr)
                (pPVar37->shader_filenames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_68 = (_Base_ptr)
                 (pPVar37->shader_filenames).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      pFVar19 = local_1f0;
      pPVar37 = local_190;
      paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_120._0_8_;
      if (p_Var33 != local_68) {
        local_70 = (_Base_ptr)&local_178->shader_path;
        do {
          validateName((string *)&local_150,*(string **)p_Var33);
          Resources::getShaderSource((Resources *)local_130,(string *)local_198);
          uVar14 = local_130._0_8_;
          local_1e8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
          local_1e8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1e8 + 0x10);
          if (((_Base_ptr)(local_130._0_8_ + 0x80))->_M_color != _S_red) {
            format_abi_cxx11_(&local_210,"#version %d\n");
            std::__cxx11::string::operator=((string *)local_1e8,(string *)&local_210);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,
                              (ulong)(local_210.field_2._M_allocated_capacity + 1));
            }
          }
          if (0 < local_d8) {
            format_abi_cxx11_(&local_210,"uniform float u[%d];\n");
            std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,
                              (ulong)(local_210.field_2._M_allocated_capacity + 1));
            }
          }
          p_Var10 = *(_Base_ptr *)(uVar14 + 0x88);
          p_Var11 = *(_Base_ptr *)(uVar14 + 0x90);
          if (p_Var10 != p_Var11) {
            local_180 = (pointer)(uVar14 + 0xa0);
            do {
              __k = &p_Var10->_M_parent;
              _Var4 = ((_Rb_tree_node_base *)(__k + -1))->_M_color;
              if (_Var4 == _S_red) {
                std::__cxx11::string::_M_append(local_1e8,(ulong)*__k);
                goto switchD_0010f1b8_default;
              }
              if (_Var4 != 2) {
                if (_Var4 != _S_black) goto switchD_0010f1b8_default;
                local_170._M_dataplus._M_p = (pointer)0x2e;
                local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
                local_210._M_dataplus._M_p =
                     (pointer)std::__cxx11::string::_M_create((ulong *)&local_210,(ulong)&local_170)
                ;
                local_210.field_2._M_allocated_capacity = (size_type)local_170._M_dataplus._M_p;
                builtin_strncpy((char *)((long)local_210._M_dataplus._M_p + 0x1e),"at shade",8);
                builtin_strncpy((char *)((long)local_210._M_dataplus._M_p + 0x26),"r source",8);
                ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)local_210._M_dataplus._M_p + 0x10))->_M_allocated_capacity =
                     0x64696c61766e6920;
                *(undefined8 *)((long)local_210._M_dataplus._M_p + 0x18) = 0x74616c66206e6920;
                *(undefined8 *)local_210._M_dataplus._M_p = 0x206564756c636e49;
                *(undefined8 *)((long)local_210._M_dataplus._M_p + 8) = 0x7369206b6e756863;
                local_210._M_string_length = (size_type)local_170._M_dataplus._M_p;
                local_170._M_dataplus._M_p[(long)local_210._M_dataplus._M_p] = '\0';
                bVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_210._M_dataplus._M_p == &local_210.field_2;
LAB_0010f4d5:
                local_1e8._40_8_ = local_210._M_dataplus._M_p;
                if (bVar39) {
                  local_1e8._40_8_ = local_1e8 + 0x38;
                  p_Stack_1a8 = (pointer)local_210.field_2._8_8_;
                }
                local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_210._M_string_length;
                local_1a0 = 0;
                bVar16 = 0;
                local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_210.field_2._M_allocated_capacity;
                goto LAB_0010f517;
              }
              cVar17 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
                               *)local_180,(key_type *)__k);
              if (cVar17._M_node == (_Base_ptr)(uVar14 + 0xa8)) {
                format_abi_cxx11_(&local_210,"Cannot find uniform chunk \'%s\' in uniforms",*__k);
LAB_0010f4c3:
                bVar39 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)local_210._M_dataplus._M_p == &local_210.field_2;
                goto LAB_0010f4d5;
              }
              cVar18 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                       ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                               *)(local_120 + 0x18),(key_type *)__k);
              if (cVar18._M_node == &local_100) {
                format_abi_cxx11_(&local_210,"Cannot find uniform \'%s\' in exported uniforms",*__k)
                ;
                goto LAB_0010f4c3;
              }
              _Var4 = cVar18._M_node[2]._M_color;
              uVar38 = (ulong)_Var4;
              if ((int)_Var4 < 0) {
                if (cVar17._M_node[2]._M_color - _S_black < 4) {
                  fVar1 = *(float *)&cVar18._M_node[2].field_0x4;
                  fVar2 = *(float *)&cVar18._M_node[2]._M_parent;
                  fVar3 = *(float *)((long)&cVar18._M_node[2]._M_parent + 4);
                  switch(cVar17._M_node[2]._M_color) {
                  case _S_black:
                    format_abi_cxx11_(&local_210,"%f",SUB84((double)fVar1,0),(ulong)(uint)fVar2,
                                      (ulong)(uint)fVar3);
                    std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                    break;
                  case 2:
                    format_abi_cxx11_(&local_210,"vec2(%f,%f)",SUB84((double)fVar1,0),(double)fVar2,
                                      (ulong)(uint)fVar3);
                    std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                    break;
                  case 3:
                    format_abi_cxx11_(&local_210,"vec3(%f,%f,%f)",SUB84((double)fVar1,0),
                                      (double)fVar2,(double)fVar3);
                    std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                    break;
                  case 4:
                    format_abi_cxx11_(&local_210,"vec4(%f,%f,%f,%f)",SUB84((double)fVar1,0),
                                      (double)fVar2,(double)fVar3,
                                      (double)*(float *)&cVar18._M_node[2]._M_left);
                    std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  }
                  goto LAB_0010f395;
                }
              }
              else {
                switch(cVar17._M_node[2]._M_color) {
                case _S_black:
                  format_abi_cxx11_(&local_210,"u[%d]");
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  break;
                case 2:
                  format_abi_cxx11_(&local_210,"vec2(u[%d],u[%d])",uVar38,(ulong)(_Var4 + _S_black))
                  ;
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  break;
                case 3:
                  format_abi_cxx11_(&local_210,"vec3(u[%d],u[%d],u[%d])",uVar38,
                                    (ulong)(_Var4 + _S_black),(ulong)(_Var4 + 2));
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  break;
                case 4:
                  format_abi_cxx11_(&local_210,"vec4(u[%d],u[%d],u[%d],u[%d])",uVar38,
                                    (ulong)(_Var4 + _S_black),(ulong)(_Var4 + 2),(ulong)(_Var4 + 3))
                  ;
                  std::__cxx11::string::_M_append(local_1e8,(ulong)local_210._M_dataplus._M_p);
                  break;
                default:
                  goto switchD_0010f1b8_default;
                }
LAB_0010f395:
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p != &local_210.field_2) {
                  operator_delete(local_210._M_dataplus._M_p,
                                  (ulong)(local_210.field_2._M_allocated_capacity + 1));
                }
              }
switchD_0010f1b8_default:
              p_Var10 = (_Base_ptr)(__k + 4);
            } while ((_Base_ptr)(__k + 4) != p_Var11);
          }
          local_1e8._40_8_ = local_1e8 + 0x38;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._0_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1e8 + 0x10)) {
            p_Stack_1a8 = (pointer)local_1e8._24_8_;
          }
          else {
            local_1e8._40_8_ = local_1e8._0_8_;
          }
          local_1b0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._16_8_;
          local_1b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1e8._8_8_;
          local_1e8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_1e8._16_8_ = local_1e8._16_8_ & 0xffffffffffffff00;
          local_1a0 = 1;
          bVar16 = 1;
          local_1e8._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_1e8 + 0x10);
LAB_0010f517:
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_1e8 + 0x10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._0_8_ != paVar25) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
            bVar16 = local_1a0;
          }
          if ((bVar16 & 1) == 0) {
            format_abi_cxx11_(&local_210,"Cannot preporcess shader \'%s\': %s",
                              *(undefined8 *)p_Var33,local_1e8._40_8_);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p == &local_210.field_2) {
              local_1e8._24_8_ = local_210.field_2._8_8_;
              _Var24._M_p = (pointer)paVar25;
            }
            else {
              local_1e8._0_8_ = local_210._M_dataplus._M_p;
              _Var24._M_p = local_210._M_dataplus._M_p;
            }
            local_1e8._16_8_ = local_210.field_2._M_allocated_capacity;
            paVar21 = &(local_188->field_0).error_.error_.field_2;
            *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              **)&local_188->field_0 = paVar21;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var24._M_p == paVar25) {
              paVar21->_M_allocated_capacity = local_210.field_2._M_allocated_capacity;
              *(undefined8 *)((long)&(local_188->field_0).error_.error_.field_2 + 8) =
                   local_1e8._24_8_;
            }
            else {
              (local_188->field_0).error_.error_._M_dataplus._M_p = _Var24._M_p;
              (local_188->field_0).error_.error_.field_2._M_allocated_capacity =
                   local_210.field_2._M_allocated_capacity;
            }
            (local_188->field_0).error_.error_._M_string_length = local_210._M_string_length;
            local_188->has_value_ = false;
            __return_storage_ptr__ = local_188;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._40_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1e8 + 0x38)) {
LAB_00110320:
              operator_delete((void *)local_1e8._40_8_,(ulong)((long)local_1b0 + 1));
            }
LAB_0011032d:
            if ((_Base_ptr)local_130._8_8_ != (_Base_ptr)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_150._M_allocated_capacity != &local_140) {
              operator_delete((void *)local_150._M_allocated_capacity,
                              local_140._M_allocated_capacity + 1);
            }
            goto LAB_00110364;
          }
          if ((local_178->shader_path)._M_string_length == 0) {
            fprintf(pFVar30,"static const char %s[] =\n",local_150._M_allocated_capacity);
            local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
            local_210.field_2._M_allocated_capacity._0_2_ = 10;
            local_210._M_string_length = 1;
            if (local_1b8 !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
              do {
                paVar21 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)std::__cxx11::string::find
                                       (local_1e8 + 0x28,(ulong)local_210._M_dataplus._M_p,
                                        (ulong)paVar25);
                if (paVar21 ==
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0xffffffffffffffff) {
                  paVar21 = local_1b8;
                }
                fprintf(pFVar30,"\t\"%.*s\\n\"\n",(ulong)(uint)((int)paVar21 - (int)paVar25),
                        (char *)((long)paVar25 + local_1e8._40_8_));
                paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(local_210._M_string_length + (long)paVar21);
              } while (paVar25 < local_1b8);
            }
            fwrite(";\n\n",3,1,pFVar30);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_210._M_dataplus._M_p != &local_210.field_2) {
              operator_delete(local_210._M_dataplus._M_p,
                              (ulong)(local_210.field_2._M_allocated_capacity + 1));
            }
          }
          else {
            std::operator+(&local_170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_70,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)p_Var33);
            aAppDebugPrintf("shader %s -> %s",local_150._M_allocated_capacity,
                            local_170._M_dataplus._M_p);
            paVar21 = local_1b8;
            uVar14 = local_1e8._40_8_;
            pFVar19 = fopen(local_170._M_dataplus._M_p,"wb");
            if (pFVar19 == (FILE *)0x0) {
              format_abi_cxx11_(&local_210,"Cannot open file \'%s\' for writing",
                                local_170._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_210._M_dataplus._M_p == &local_210.field_2) {
                local_1e8._24_8_ = local_210.field_2._8_8_;
                local_1e8._0_8_ = paVar25;
              }
              else {
                local_1e8._0_8_ = local_210._M_dataplus._M_p;
              }
              local_1e8._16_8_ = local_210.field_2._M_allocated_capacity;
              local_1e8._8_8_ = local_210._M_string_length;
              local_1e8[0x20] = 0;
            }
            else {
              paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)fwrite((void *)uVar14,1,(size_t)paVar21,pFVar19);
              if (paVar20 == paVar21) {
                local_1e8[0x20] = 1;
              }
              else {
                format_abi_cxx11_(&local_210,"Cannot write %zu bytes, could write only %zu",paVar21,
                                  paVar20);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_210._M_dataplus._M_p == &local_210.field_2) {
                  local_1e8._24_8_ = local_210.field_2._8_8_;
                  local_1e8._0_8_ = paVar25;
                }
                else {
                  local_1e8._0_8_ = local_210._M_dataplus._M_p;
                }
                local_1e8._16_8_ = local_210.field_2._M_allocated_capacity;
                local_1e8._8_8_ = local_210._M_string_length;
                local_1e8[0x20] = 0;
              }
              fclose(pFVar19);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_170._M_dataplus._M_p != &local_170.field_2) {
              operator_delete(local_170._M_dataplus._M_p,
                              (ulong)(local_170.field_2._M_allocated_capacity + 1));
            }
            if ((local_1e8[0x20] & 1) == 0) {
              format_abi_cxx11_(&local_170,"Cannot write shader \'%s\': %s",
                                local_150._M_allocated_capacity,local_1e8._0_8_);
              __return_storage_ptr__ = local_188;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_170._M_dataplus._M_p == &local_170.field_2) {
                _Var24._M_p = (pointer)&local_210.field_2;
                local_210.field_2._8_8_ = local_170.field_2._8_8_;
              }
              else {
                local_210._M_dataplus._M_p = local_170._M_dataplus._M_p;
                _Var24._M_p = local_170._M_dataplus._M_p;
              }
              local_210.field_2._M_allocated_capacity = local_170.field_2._M_allocated_capacity;
              paVar21 = &(local_188->field_0).error_.error_.field_2;
              *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                **)&local_188->field_0 = paVar21;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var24._M_p == &local_210.field_2) {
                paVar21->_M_allocated_capacity = local_170.field_2._M_allocated_capacity;
                *(undefined8 *)((long)&(local_188->field_0).error_.error_.field_2 + 8) =
                     local_210.field_2._8_8_;
              }
              else {
                (local_188->field_0).error_.error_._M_dataplus._M_p = _Var24._M_p;
                (local_188->field_0).error_.error_.field_2._M_allocated_capacity =
                     local_170.field_2._M_allocated_capacity;
              }
              (local_188->field_0).error_.error_._M_string_length = local_170._M_string_length;
              local_188->has_value_ = false;
              if (((local_1e8[0x20] & 1) == 0) &&
                 ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._0_8_ != paVar25)) {
                operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._40_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_1e8 + 0x38)) goto LAB_00110320;
              goto LAB_0011032d;
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._40_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1e8 + 0x38)) {
            operator_delete((void *)local_1e8._40_8_,(ulong)((long)local_1b0 + 1));
          }
          if ((_Base_ptr)local_130._8_8_ != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_130._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_allocated_capacity != &local_140) {
            operator_delete((void *)local_150._M_allocated_capacity,
                            local_140._M_allocated_capacity + 1);
          }
          p_Var33 = p_Var33 + 1;
          pFVar19 = local_1f0;
          pPVar37 = local_190;
          paVar25 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_120._0_8_;
        } while (p_Var33 != local_68);
      }
      for (; pFVar30 = local_1f0, local_1f0 = pFVar19, local_190 = pPVar37,
          paVar25 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._8_8_; paVar25 = paVar25 + 6) {
        if (*(int *)paVar25 == 0) {
          fprintf(pFVar30,"#pragma data_seg(\".%s\")\n",*(undefined8 *)(paVar25->_M_local_buf + 8));
          fprintf(pFVar30,"%.*s\n",
                  (ulong)(uint)(*(int *)(paVar25->_M_local_buf + 0x50) -
                               (int)*(undefined8 *)(paVar25->_M_local_buf + 0x48)));
        }
        pFVar19 = local_1f0;
        pPVar37 = local_190;
        local_1f0 = pFVar30;
      }
      pTVar22 = (pPVar37->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar12 = (pPVar37->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar22 != pTVar12) {
        fprintf(pFVar19,"static GLuint textures[%d];\n",
                (ulong)(uint)((int)((ulong)((long)pTVar12 - (long)pTVar22) >> 4) * -0x55555555));
      }
      if ((pPVar37->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_start !=
          (pPVar37->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        fprintf(pFVar19,"static GLuint framebuffers[%d];\n",
                (ulong)(uint)((int)((ulong)((long)(pPVar37->textures).
                                                  super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                           (long)(pPVar37->textures).
                                                 super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                                 ._M_impl.super__Vector_impl_data._M_start) >> 4) *
                             -0x55555555));
      }
      fprintf(pFVar19,"static GLuint programs[%d];\n",
              (ulong)((long)(pPVar37->programs).
                            super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pPVar37->programs).
                           super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                           ._M_impl.super__Vector_impl_data._M_start) >> 3);
      fwrite("\nstatic void videoInit() {\n",0x1b,1,pFVar19);
      pTVar22 = (pPVar37->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pTVar12 = (pPVar37->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pTVar22 != pTVar12) {
        fprintf(pFVar19,"\tglGenTextures(%d, textures);\n",
                (ulong)(uint)((int)((ulong)((long)pTVar12 - (long)pTVar22) >> 4) * -0x55555555));
      }
      pFVar29 = (pPVar37->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pFVar13 = (pPVar37->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pFVar29 != pFVar13) {
        fprintf(pFVar19,"\tglGenFramebuffers(%d, framebuffers);\n",
                (ulong)(uint)((int)((ulong)((long)pFVar13 - (long)pFVar29) >> 2) * -0x33333333));
      }
      pTVar22 = (pPVar37->textures).
                super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (pTVar22 !=
          (pPVar37->textures).
          super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        lVar28 = 8;
        uVar38 = 0;
        do {
          uVar35 = (ulong)*(uint *)((long)&pTVar22->w + lVar28);
          pcVar26 = "";
          pcVar31 = "";
          if (uVar35 < 3) {
            pcVar26 = &DAT_001b76cc + *(int *)(&DAT_001b76cc + uVar35 * 4);
            pcVar31 = &DAT_001b76d8 + *(int *)(&DAT_001b76d8 + uVar35 * 4);
          }
          fprintf(local_1f0,"\ttextureInit(textures[%d], %d, %d, %s, %s);\n",uVar38 & 0xffffffff,
                  (ulong)*(uint *)((long)pTVar22 + lVar28 + -8),
                  (ulong)*(uint *)((long)pTVar22 + lVar28 + -4),pcVar31,pcVar26);
          uVar38 = uVar38 + 1;
          pTVar22 = (local_190->textures).
                    super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          lVar28 = lVar28 + 0x30;
        } while (uVar38 < (ulong)(((long)(local_190->textures).
                                         super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar22
                                  >> 4) * -0x5555555555555555));
        fputc(10,local_1f0);
        pPVar37 = local_190;
      }
      pFVar30 = local_1f0;
      pFVar29 = (pPVar37->framebuffers).
                super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (pFVar29 !=
          (pPVar37->framebuffers).
          super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        local_198 = (Resources *)0x4;
        uVar38 = 0;
        do {
          fprintf(pFVar30,"\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n",
                  uVar38 & 0xffffffff);
          pRVar15 = local_198;
          if (0 < pFVar29[uVar38].textures_count) {
            uVar35 = 0;
            do {
              fprintf(pFVar30,
                      "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, GL_TEXTURE_2D, textures[%d], 0);\n"
                      ,uVar35 & 0xffffffff,
                      (ulong)*(uint *)((long)pFVar29->textures + (long)pRVar15 + uVar35 * 4 + -4));
              uVar35 = uVar35 + 1;
            } while ((long)uVar35 < (long)pFVar29[uVar38].textures_count);
          }
          uVar38 = uVar38 + 1;
          pFVar29 = (local_190->framebuffers).
                    super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          local_198 = (Resources *)((local_198->project_root_)._M_pathname.field_2._M_local_buf + 4)
          ;
        } while (uVar38 < (ulong)(((long)(local_190->framebuffers).
                                         super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pFVar29
                                  >> 2) * -0x3333333333333333));
        fputc(10,local_1f0);
        pPVar37 = local_190;
      }
      pFVar30 = local_1f0;
      pPVar23 = (pPVar37->programs).
                super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if ((pPVar37->programs).
          super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>._M_impl.
          super__Vector_impl_data._M_finish != pPVar23) {
        uVar38 = 0;
        do {
          validateName((string *)(local_1e8 + 0x28),
                       (string *)
                       (pPVar37->shader_filenames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[pPVar23[uVar38].vertex]._M_dataplus
                       ._M_p);
          uVar14 = local_1e8._40_8_;
          validateName((string *)local_1e8,
                       (string *)
                       (pPVar37->shader_filenames).
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start
                       [(pPVar37->programs).
                        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                        ._M_impl.super__Vector_impl_data._M_start[uVar38].fragment]._M_dataplus._M_p
                      );
          fprintf(pFVar30,"\tprograms[%d] = programInit(%s, %s);\n",uVar38 & 0xffffffff,uVar14,
                  local_1e8._0_8_);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1e8 + 0x10)) {
            operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._40_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_1e8 + 0x38)) {
            operator_delete((void *)local_1e8._40_8_,(ulong)((long)local_1b0 + 1));
          }
          uVar38 = uVar38 + 1;
          pPVar23 = (local_190->programs).
                    super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          pPVar37 = local_190;
        } while (uVar38 < (ulong)((long)(local_190->programs).
                                        super__Vector_base<renderdesc::Program,_std::allocator<renderdesc::Program>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar23
                                 >> 3));
      }
      fwrite("}\n\n",3,1,pFVar30);
      fwrite("static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n"
             ,0x80,1,pFVar30);
      fwrite("static void videoPaint(float t) {\n",0x22,1,pFVar30);
      fwrite("\tint current_program;\n\tstatic unsigned int frame_seq = 0;\n\t++frame_seq;\n\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n"
             ,0x8d,1,pFVar30);
      pCVar36 = (pPVar37->commands).
                super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pCVar34 = (pPVar37->commands).
                super__Vector_base<renderdesc::Command,_std::allocator<renderdesc::Command>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if (pCVar36 != pCVar34) {
        local_198 = (Resources *)0x0;
        local_180 = pCVar34;
        do {
          pPVar37 = local_190;
          pRVar15 = local_198;
          switch(pCVar36->op) {
          case BindFramebuffer:
            lVar28 = (long)(pCVar36->bindFramebuffer).framebuffer.index;
            if (lVar28 == -1) {
              fwrite("\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n",0x27,1,pFVar30);
              uVar6 = local_178->width;
              uVar7 = local_178->height;
            }
            else {
              pFVar29 = (local_190->framebuffers).
                        super__Vector_base<renderdesc::Framebuffer,_std::allocator<renderdesc::Framebuffer>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              fprintf(local_1f0,"\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",lVar28,
                      *(undefined8 *)
                       (&DAT_001f80c0 + (ulong)(pCVar36->bindFramebuffer).framebuffer.pingpong * 8))
              ;
              fprintf(local_1f0,"\tglDrawBuffers(%d, draw_buffers);\n",
                      (ulong)(uint)pFVar29[lVar28].textures_count);
              iVar5 = pFVar29[lVar28].textures[0];
              pTVar22 = (pPVar37->textures).
                        super__Vector_base<renderdesc::Texture,_std::allocator<renderdesc::Texture>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar6 = pTVar22[iVar5].w;
              uVar7 = pTVar22[iVar5].h;
              pFVar30 = local_1f0;
              pCVar34 = local_180;
            }
            fprintf(pFVar30,"\tglViewport(0, 0, %d, %d);\n",(ulong)uVar6,(ulong)uVar7);
            break;
          case UseProgram:
            local_198 = (Resources *)0x0;
            fprintf(pFVar30,"\tcurrent_program = programs[%d];\n",
                    (ulong)(uint)(pCVar36->useProgram).program.index);
            fwrite("\tglUseProgram(current_program);\n",0x20,1,pFVar30);
            fwrite("\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n"
                   ,0x56,1,pFVar30);
            fprintf(pFVar30,"\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n"
                    ,(ulong)(uint)local_178->width,(ulong)(uint)local_178->height);
            __size = 0x3d;
            pcVar26 = "\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n";
            goto LAB_0010ff4c;
          case BindTexture:
            iVar5 = (int)local_198;
            fprintf(local_1f0,"\tglActiveTexture(GL_TEXTURE0 + %d);\n",(ulong)local_198 & 0xffffffff
                   );
            fprintf(local_1f0,"\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n",
                    (ulong)(uint)(pCVar36->bindTexture).texture.index,
                    *(undefined8 *)
                     (&DAT_001f80c0 + (ulong)(pCVar36->bindTexture).texture.pingpong * 8));
            fprintf(local_1f0,"\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n",
                    (pCVar36->bindTexture).name._M_dataplus._M_p,(ulong)pRVar15 & 0xffffffff);
            local_198 = (Resources *)(ulong)(iVar5 + 1);
            pFVar30 = local_1f0;
            break;
          case DrawFullscreen:
            __size = 0x15;
            pcVar26 = "\tglRects(-1,-1,1,1);\n";
            goto LAB_0010ff4c;
          case Clear:
            fprintf(pFVar30,"\tglClearColor(%f, %f, %f, %f);\n",SUB84((double)(pCVar36->clear).r,0),
                    (double)(pCVar36->clear).g,(double)(pCVar36->clear).b,(double)(pCVar36->clear).a
                   );
            pcVar26 = "";
            if ((pCVar36->clear).depth != false) {
              pcVar26 = " | GL_DEPTH_BUFFER_BIT";
            }
            fprintf(pFVar30,"\tglClear(GL_COLOR_BUFFER_BIT%s);\n",pcVar26);
            break;
          case Enable:
            FVar8 = (pCVar36->enable).flag;
            if (FVar8 == VertexProgramPointSize) {
              __size = 0x29;
              pcVar26 = "\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n";
            }
            else {
              if (FVar8 != DepthTest) break;
              __size = 0x1a;
              pcVar26 = "\tglEnable(GL_DEPTH_TEST);\n";
            }
            goto LAB_0010ff4c;
          case Disable:
            FVar8 = (pCVar36->disable).flag;
            if (FVar8 == VertexProgramPointSize) {
              __size = 0x2a;
              pcVar26 = "\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n";
            }
            else {
              if (FVar8 != DepthTest) break;
              __size = 0x1b;
              pcVar26 = "\tglDisable(GL_DEPTH_TEST);\n";
            }
LAB_0010ff4c:
            fwrite(pcVar26,__size,1,pFVar30);
            break;
          case DrawArrays:
            uVar38 = (ulong)(pCVar36->drawArrays).mode;
            if (uVar38 < 7) {
              puVar27 = &DAT_001b76e4 + *(int *)(&DAT_001b76e4 + uVar38 * 4);
            }
            else {
              puVar27 = (undefined *)0x0;
            }
            fprintf(pFVar30,"\tglDrawArrays(%s, %d, %d);\n",puVar27,
                    (ulong)(uint)(pCVar36->drawArrays).start,
                    (ulong)(uint)(pCVar36->drawArrays).count);
          }
          pCVar36 = pCVar36 + 1;
        } while (pCVar36 != pCVar34);
      }
      fwrite("}\n",2,1,pFVar30);
      aAppDebugPrintf("Done exporting rendering pipeline to \'%s\'",local_78);
      local_188->has_value_ = true;
      __return_storage_ptr__ = local_188;
LAB_00110364:
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_IAutomation::ExportedUniform>_>_>
                   *)(local_120 + 0x18));
      std::vector<Section,_std::allocator<Section>_>::~vector
                ((vector<Section,_std::allocator<Section>_> *)local_120);
    }
    Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected((Expected<IAutomation::ExportResult,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_d0);
LAB_0011038b:
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_shader::UniformDeclaration>_>_>
    ::~_Rb_tree(&local_60);
    fclose(pFVar30);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<void, std::string> exportC(Resources &res, const ExportSettings &settings, const renderdesc::Pipeline &p, const IAutomation &automation) {
	const char * const filename = settings.c_source.c_str();
	MSG("Exporting rendering pipeline to '%s'", filename);

	const auto f = std::unique_ptr<FILE, decltype(&fclose)>(fopen(filename, "w"), &fclose);
	if (!f)
		return Unexpected(format("Cannot open file '%s' for writing", filename));

	// Extract all uniforms from all shaders
	shader::UniformsMap global_uniforms;
	for (const auto &s: p.shader_filenames) {
		const auto shader = res.getShaderSource(s);
		if (!shader)
			return Unexpected(format("Cannot open shader '%s'", s.c_str()));

		// if (!shader->poll(1))
		// 	return Unexpected(format("Cannot read shader '%s'", s.c_str()));

		MSG("%s: uniforms: %d", s.c_str(), (int)shader->flatSource().uniforms().size());
		const auto result = shader::appendUniforms(global_uniforms, shader->flatSource().uniforms());
		if (!result)
			return Unexpected("Error merging uniforms from vertex: " + result.error());
	}

	// Export automation for all known uniforms
	auto automation_export = automation.writeExport("C", global_uniforms);
	if (!automation_export)
		return Unexpected(format("Error exporting automation data: %s", automation_export.error().c_str()));

	const IAutomation::ExportResult automation_result(std::move(automation_export.value()));

	// write shader sources given automation export
	for (const auto &s: p.shader_filenames) {
		const std::string vname = validateName(s);
		const auto shader = res.getShaderSource(s);

		auto shader_source = shaderPreprocessor(shader->flatSource(), automation_result);
		if (!shader_source)
			return Unexpected(format("Cannot preporcess shader '%s': %s", s.c_str(), shader_source.error().c_str()));

		if (auto result = writeShaderSource(f.get(), s, vname, shader_source.value(), settings)) {}
		else
			return Unexpected(format("Cannot write shader '%s': %s", vname.c_str(), result.error().c_str()));
	}

	// Write global data
	for (const auto &it: automation_result.sections) {
		if (it.type == Section::Type::Data) {
			fprintf(f.get(), "#pragma data_seg(\".%s\")\n", it.name.c_str());
			fprintf(f.get(), "%.*s\n", static_cast<int>(it.data.size()), it.data.data());
		}
	}

	if (!p.textures.empty())
		fprintf(f.get(), "static GLuint textures[%d];\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "static GLuint framebuffers[%d];\n", (int)p.textures.size());

	fprintf(f.get(), "static GLuint programs[%d];\n", (int)p.programs.size());

	fprintf(f.get(), "\nstatic void videoInit() {\n");

	if (!p.textures.empty())
		fprintf(f.get(), "\tglGenTextures(%d, textures);\n", (int)p.textures.size());

	if (!p.framebuffers.empty())
		fprintf(f.get(), "\tglGenFramebuffers(%d, framebuffers);\n", (int)p.framebuffers.size());

	if (!p.textures.empty()) {
		for (size_t i = 0; i < p.textures.size(); ++i) {
			const renderdesc::Texture &t = p.textures[i];
			const char *comp = "", *type = "";

			switch (t.pixel_type) {
				case RGBA8:
					comp = "GL_RGBA";
					type = "GL_UNSIGNED_BYTE";
					break;
#ifndef ATTO_PLATFORM_RPI
				case RGBA16F:
					comp = "GL_RGBA16F";
					type = "GL_FLOAT";
					break;
				case RGBA32F:
					comp = "GL_RGBA32F";
					type = "GL_FLOAT";
					break;
#endif
			}

			fprintf(f.get(), "\ttextureInit(textures[%d], %d, %d, %s, %s);\n",
				(int)i, t.w, t.h, comp, type);
		}

		fprintf(f.get(), "\n");
	}

	if (!p.framebuffers.empty()) {
		for (size_t i = 0; i < p.framebuffers.size(); ++i) {
			const renderdesc::Framebuffer &fb = p.framebuffers[i];
			fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d]);\n", (int)i);
			for (int ti = 0; ti < fb.textures_count; ++ti) {
				fprintf(f.get(), "\tglFramebufferTexture2D(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0 + %d, "
					"GL_TEXTURE_2D, textures[%d], 0);\n", ti, fb.textures[ti]);
			}
		}

		fprintf(f.get(), "\n");
	}

	for (size_t i = 0; i < p.programs.size(); ++i) {
		fprintf(f.get(), "\tprograms[%d] = programInit(%s, %s);\n", (int)i,
			validateName(p.shader_filenames[p.programs[i].vertex]).c_str(),
			validateName(p.shader_filenames[p.programs[i].fragment]).c_str());
	}

	fprintf(f.get(), "}\n\n");

	// TODO actual count
	fprintf(f.get(), "static const GLuint draw_buffers[] = {GL_COLOR_ATTACHMENT0, GL_COLOR_ATTACHMENT1, GL_COLOR_ATTACHMENT2, GL_COLOR_ATTACHMENT3};\n\n");

	fprintf(f.get(), "static void videoPaint(float t) {\n");

	const char *pingpong[3] = {"", "+ping", "+pong"};
	fprintf(f.get(),
		"\tint current_program;\n"
		"\tstatic unsigned int frame_seq = 0;\n"
		"\t++frame_seq;\n"
		"\tconst int ping = (int)(frame_seq&1), pong = (int)((frame_seq+1)&1);\n");

	int first_texture_slot = 0;
	for (const auto &cmd: p.commands) {
		switch (cmd.op) {
			case renderdesc::Command::Op::BindFramebuffer:
				{
					const renderdesc::Command::BindFramebuffer &cmdfb = cmd.bindFramebuffer;
					if (cmdfb.framebuffer.index == -1) {
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, 0);\n");
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n", settings.width, settings.height);
					} else {
						const renderdesc::Framebuffer &fb = p.framebuffers[cmdfb.framebuffer.index];
						fprintf(f.get(), "\tglBindFramebuffer(GL_FRAMEBUFFER, framebuffers[%d%s]);\n",
							cmdfb.framebuffer.index, pingpong[cmdfb.framebuffer.pingpong]);
						fprintf(f.get(), "\tglDrawBuffers(%d, draw_buffers);\n", fb.textures_count);
						fprintf(f.get(), "\tglViewport(0, 0, %d, %d);\n",
							p.textures[fb.textures[0]].w,
							p.textures[fb.textures[0]].h);
					}
					break;
				}

			case renderdesc::Command::Op::UseProgram:
				{
					const renderdesc::Command::UseProgram &cmdp = cmd.useProgram;
					const int pi = cmdp.program.index;
					fprintf(f.get(), "\tcurrent_program = programs[%d];\n", pi);
					fprintf(f.get(), "\tglUseProgram(current_program);\n");
					fprintf(f.get(), "\tglUniform1fv(glGetUniformLocation(current_program, \"u\"), AUTOMATION_SIZE, uniforms);\n");
					fprintf(f.get(), "\tglUniform2f(glGetUniformLocation(current_program, \"R\"), %d, %d);\n", settings.width, settings.height);
					fprintf(f.get(), "\tglUniform1f(glGetUniformLocation(current_program, \"t\"), t);\n");

					// FIXME load automated uniforms

					first_texture_slot = 0;
					break;
				}

			case renderdesc::Command::Op::BindTexture:
				{
					const auto &cmdtex = cmd.bindTexture;
					const int slot = first_texture_slot++;
					fprintf(f.get(), "\tglActiveTexture(GL_TEXTURE0 + %d);\n", slot);
					fprintf(f.get(), "\tglBindTexture(GL_TEXTURE_2D, textures[%d%s]);\n", cmdtex.texture.index, pingpong[cmdtex.texture.pingpong]);
					fprintf(f.get(), "\tglUniform1i(glGetUniformLocation(current_program, \"%s\"), %d);\n", cmdtex.name.c_str(), slot);
					break;
				}

			case renderdesc::Command::Op::Clear:
				{
					const auto &cmdc = cmd.clear;
					fprintf(f.get(), "\tglClearColor(%f, %f, %f, %f);\n", cmdc.r, cmdc.g, cmdc.b, cmdc.a);
					fprintf(f.get(), "\tglClear(GL_COLOR_BUFFER_BIT%s);\n", cmdc.depth?" | GL_DEPTH_BUFFER_BIT":"");
					break;
				}

			case renderdesc::Command::Op::Enable:
				switch (cmd.enable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglEnable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglEnable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::Disable:
				switch (cmd.disable.flag) {
					case renderdesc::Command::Flag::DepthTest:
						fprintf(f.get(), "\tglDisable(GL_DEPTH_TEST);\n");
						break;
#ifndef ATTO_PLATFORM_RPI
					case renderdesc::Command::Flag::VertexProgramPointSize:
						fprintf(f.get(), "\tglDisable(GL_VERTEX_PROGRAM_POINT_SIZE);\n");
						break;
#endif
				}
				break;
			case renderdesc::Command::Op::DrawArrays:
				{
					const char *mode = nullptr;
					switch (cmd.drawArrays.mode) {
						case renderdesc::Command::DrawArrays::Mode::Lines: mode = "GL_LINES"; break;
						case renderdesc::Command::DrawArrays::Mode::LineStrip: mode = "GL_LINE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::LineLoop: mode = "GL_LINE_LOOP"; break;
						case renderdesc::Command::DrawArrays::Mode::Points: mode = "GL_POINTS"; break;
						case renderdesc::Command::DrawArrays::Mode::Triangles: mode = "GL_TRIANGLES"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleStrip: mode = "GL_TRIANGLE_STRIP"; break;
						case renderdesc::Command::DrawArrays::Mode::TriangleFan: mode = "GL_TRIANGLE_FAN"; break;
					}
					fprintf(f.get(), "\tglDrawArrays(%s, %d, %d);\n", mode, cmd.drawArrays.start, cmd.drawArrays.count);
				}
				break;
			case renderdesc::Command::Op::DrawFullscreen:
				fprintf(f.get(), "\tglRects(-1,-1,1,1);\n");
				break;
		}
	}

	fprintf(f.get(), "}\n");
	MSG("Done exporting rendering pipeline to '%s'", filename);

	return Expected<void, std::string>();
}